

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderBarrierTestCase::iterate(TessellationShaderBarrierTestCase *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  NotSupportedError *this_00;
  char *description;
  bool bVar5;
  GLenum drawcall_mode;
  GLenum tf_mode;
  GLint n_patch_vertices;
  GLint drawcall_n_instances;
  GLint drawcall_count;
  long lVar3;
  
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    drawcall_count = 0;
    drawcall_mode = 0;
    drawcall_n_instances = 1;
    n_patch_vertices = 0;
    tf_mode = 0;
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])
              (this,&drawcall_mode,&drawcall_count,&tf_mode,&n_patch_vertices,&drawcall_n_instances)
    ;
    (**(code **)(lVar3 + 0x5e0))(0x8c89);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glEnable(GL_RASTERIZER_DISCARD) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x102);
    (**(code **)(lVar3 + 0xfd8))
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,n_patch_vertices);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glPatchParameteriEXT() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x105);
    (**(code **)(lVar3 + 0x1680))(this->m_po_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x108);
    (**(code **)(lVar3 + 0x30))(tf_mode);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBeginTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x10b);
    if (drawcall_n_instances == 1) {
      (**(code **)(lVar3 + 0x538))();
    }
    else {
      (**(code **)(lVar3 + 0x548))(drawcall_mode,0,drawcall_count);
    }
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glDrawArrays() or glDrawArraysInstanced() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x117);
    (**(code **)(lVar3 + 0x638))();
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x11a);
    iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(this);
    uVar4 = (**(code **)(lVar3 + 0xd00))(0x8c8e,0,(long)iVar1,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glMapBufferRange() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x122);
    iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                      (this,uVar4);
    (**(code **)(lVar3 + 0x1670))(0x8c8e);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUnmapBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
                    ,0x12a);
    bVar5 = (char)iVar1 == '\0';
    if (bVar5) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar5,
               description);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&drawcall_count,"Tessellation shader functionality not supported, skipping",
             (allocator<char> *)&drawcall_mode);
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&drawcall_count);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderBarrierTestCase::iterate(void)
{
	initTest();

	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Prepare for the draw call */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint  drawcall_count		 = 0;
	glw::GLenum drawcall_mode		 = GL_NONE;
	glw::GLint  drawcall_n_instances = 1;
	glw::GLint  n_patch_vertices	 = 0;
	glw::GLenum tf_mode				 = GL_NONE;

	getDrawCallArgs(&drawcall_mode, &drawcall_count, &tf_mode, &n_patch_vertices, &drawcall_n_instances);

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, n_patch_vertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed");

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

	gl.beginTransformFeedback(tf_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
	{
		if (drawcall_n_instances == 1)
		{
			gl.drawArrays(drawcall_mode, 0 /* first */, drawcall_count);
		}
		else
		{
			DE_ASSERT(drawcall_n_instances > 1);

			gl.drawArraysInstanced(drawcall_mode, 0 /* first */, drawcall_count, drawcall_n_instances);
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() or glDrawArraysInstanced() failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

	/* Retrieve the data generated by XFB */
	int			bo_size  = getXFBBufferSize();
	const void* xfb_data = NULL;

	xfb_data = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, bo_size, GL_MAP_READ_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

	/* Verify the data */
	bool is_xfb_data_valid = verifyXFBBuffer(xfb_data);

	/* Unmap the buffer object */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");

	/* Set the test result, depending on the verification outcome */
	if (is_xfb_data_valid)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}